

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O3

void __thiscall BMRS_XZ<RemSP>::SecondScan(BMRS_XZ<RemSP> *this)

{
  size_t __n;
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint64_t *puVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  Run *pRVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  Run *pRVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long local_a8;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pRVar20 = (this->data_runs).runs;
  uVar22 = *(uint *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  if (1 < (int)uVar22) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    puVar6 = (this->data_compressed).bits;
    lVar7 = *(long *)&pMVar5->field_0x10;
    lVar8 = **(long **)&pMVar5->field_0x48;
    lVar14 = lVar8 * 2;
    lVar19 = 0;
    uVar13 = 0;
    local_a8 = lVar7;
    do {
      puVar9 = RemSP::P_;
      iVar26 = (this->data_compressed).data_width;
      iVar12 = (int)uVar13 * iVar26;
      uVar21 = 0;
      pRVar10 = pRVar20;
      do {
        pRVar20 = pRVar10;
        if (pRVar20->start_pos == 0xffff) {
          if ((int)uVar21 < iVar3) {
            __n = (ulong)((iVar3 + -1) - uVar21) * 4 + 4;
            memset((void *)(lVar14 * uVar13 + lVar7 + (ulong)uVar21 * 4),0,__n);
            memset((void *)(lVar8 + lVar7 + lVar14 * uVar13 + (ulong)uVar21 * 4),0,__n);
          }
          pRVar20 = pRVar20 + 1;
          break;
        }
        uVar1 = pRVar20->end_pos;
        uVar16 = puVar9[pRVar20->label];
        uVar17 = (uint)pRVar20->start_pos;
        if (uVar21 < uVar17) {
          uVar18 = (ulong)uVar21;
          lVar11 = local_a8 + uVar18 * 4;
          lVar24 = 0;
          do {
            *(undefined4 *)(lVar11 + lVar24 * 4) = 0;
            *(undefined4 *)(lVar8 + lVar11 + lVar24 * 4) = 0;
            lVar24 = lVar24 + 1;
            uVar21 = uVar17;
          } while (uVar17 - uVar18 != lVar24);
        }
        if (uVar21 < uVar1) {
          uVar18 = (ulong)uVar21;
          uVar21 = (uint)uVar1;
          do {
            lVar11 = (long)((int)(uint)uVar18 >> 6);
            uVar15 = (uint)uVar18 & 0x3f;
            uVar23 = uVar16;
            if ((puVar6[iVar12 * 2 + lVar11] >> uVar15 & 1) == 0) {
              uVar23 = 0;
            }
            *(uint *)(lVar7 + lVar19 + uVar18 * 4) = uVar23;
            uVar23 = uVar16;
            if ((puVar6[(long)(iVar12 * 2) + iVar26 + lVar11] >> uVar15 & 1) == 0) {
              uVar23 = 0;
            }
            *(uint *)(lVar8 + lVar7 + lVar19 + uVar18 * 4) = uVar23;
            uVar18 = uVar18 + 1;
          } while (uVar21 != uVar18);
        }
        pRVar10 = pRVar20 + 1;
      } while (uVar17 != 0xffff);
      uVar13 = uVar13 + 1;
      local_a8 = local_a8 + lVar14;
      lVar19 = lVar19 + lVar14;
    } while (uVar13 != uVar22 >> 1);
  }
  puVar9 = RemSP::P_;
  if ((uVar22 & 1) != 0) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar8 = *(long *)&pMVar5->field_0x10;
    lVar14 = (long)(int)(uVar22 - 1) * **(long **)&pMVar5->field_0x48;
    lVar7 = lVar8 + lVar14;
    uVar22 = 0;
    auVar29 = _DAT_00328420;
    auVar30 = _DAT_00328430;
    auVar31 = _DAT_00328440;
    do {
      uVar1 = pRVar20->start_pos;
      if (uVar1 == 0xffff) {
        if (iVar3 <= (int)uVar22) {
          return;
        }
        memset((void *)(lVar7 + (ulong)uVar22 * 4),0,(ulong)(iVar3 + ~uVar22) * 4 + 4);
        return;
      }
      uVar2 = pRVar20->end_pos;
      uVar21 = puVar9[pRVar20->label];
      uVar16 = (uint)uVar1;
      if (uVar22 < uVar16) {
        memset((void *)(lVar7 + (ulong)uVar22 * 4),0,(ulong)(~uVar22 + uVar16) * 4 + 4);
        auVar29 = _DAT_00328420;
        auVar30 = _DAT_00328430;
        auVar31 = _DAT_00328440;
      }
      uVar22 = uVar16;
      if (uVar1 < uVar2) {
        uVar22 = (uint)uVar2;
        lVar11 = (ulong)uVar2 - (ulong)uVar16;
        lVar19 = lVar11 + -1;
        auVar25._8_4_ = (int)lVar19;
        auVar25._0_8_ = lVar19;
        auVar25._12_4_ = (int)((ulong)lVar19 >> 0x20);
        lVar19 = lVar8 + lVar14 + 0xc + (ulong)uVar16 * 4;
        auVar25 = auVar25 ^ auVar31;
        uVar13 = 0;
        do {
          auVar27._8_4_ = (int)uVar13;
          auVar27._0_8_ = uVar13;
          auVar27._12_4_ = (int)(uVar13 >> 0x20);
          auVar28 = (auVar27 | auVar30) ^ auVar31;
          iVar26 = auVar25._4_4_;
          if ((bool)(~(iVar26 < auVar28._4_4_ ||
                      auVar25._0_4_ < auVar28._0_4_ && auVar28._4_4_ == iVar26) & 1)) {
            *(uint *)(lVar19 + -0xc + uVar13 * 4) = uVar21;
          }
          if (auVar28._12_4_ <= auVar25._12_4_ &&
              (auVar28._8_4_ <= auVar25._8_4_ || auVar28._12_4_ != auVar25._12_4_)) {
            *(uint *)(lVar19 + -8 + uVar13 * 4) = uVar21;
          }
          auVar27 = (auVar27 | auVar29) ^ auVar31;
          iVar12 = auVar27._4_4_;
          if (iVar12 <= iVar26 && (iVar12 != iVar26 || auVar27._0_4_ <= auVar25._0_4_)) {
            *(uint *)(lVar19 + -4 + uVar13 * 4) = uVar21;
            *(uint *)(lVar19 + uVar13 * 4) = uVar21;
          }
          uVar13 = uVar13 + 4;
        } while ((lVar11 + 3U & 0xfffffffffffffffc) != uVar13);
      }
      pRVar20 = pRVar20 + 1;
    } while (uVar1 != 0xffff);
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels_u[k] = 0;
                    for (int k = j; k < w; k++) labels_d[k] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (; j < start_pos; j++) labels_u[j] = 0, labels_d[j] = 0;
                for (; j < end_pos; j++) {
                    labels_u[j] = (data_u[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                    labels_d[j] = (data_d[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels[k] = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }
    }